

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

double __thiscall AmpIO::ReadWatchdogPeriodInSeconds(AmpIO *this)

{
  int32_t iVar1;
  
  iVar1 = ReadWatchdogPeriod(this,true);
  return (double)iVar1 * 5.208333333333333e-06;
}

Assistant:

double AmpIO::ReadWatchdogPeriodInSeconds(void) const
{
    return ReadWatchdogPeriod()*WDOG_ClockPeriod;
}